

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# number_padding.cpp
# Opt level: O0

int32_t __thiscall
icu_63::number::impl::Padder::padAndApply
          (Padder *this,Modifier *mod1,Modifier *mod2,NumberStringBuilder *string,int32_t leftIndex,
          int32_t rightIndex,UErrorCode *status)

{
  UNumberFormatPadPosition UVar1;
  UChar32 paddingCp_00;
  int iVar2;
  int iVar3;
  int32_t iVar4;
  int iVar5;
  UChar32 paddingCp;
  PadPosition position;
  int length;
  int32_t requiredPadding;
  int32_t modLength;
  int32_t rightIndex_local;
  int32_t leftIndex_local;
  NumberStringBuilder *string_local;
  Modifier *mod2_local;
  Modifier *mod1_local;
  Padder *this_local;
  
  iVar2 = (*mod1->_vptr_Modifier[4])();
  iVar3 = (*mod2->_vptr_Modifier[4])();
  iVar5 = this->fWidth;
  iVar4 = NumberStringBuilder::codePointCount(string);
  iVar5 = (iVar5 - (iVar2 + iVar3)) - iVar4;
  paddingCp = 0;
  if (iVar5 < 1) {
    iVar5 = (*mod1->_vptr_Modifier[2])
                      (mod1,string,(ulong)(uint)leftIndex,(ulong)(uint)rightIndex,status);
    iVar2 = (*mod2->_vptr_Modifier[2])
                      (mod2,string,(ulong)(uint)leftIndex,(ulong)(uint)(rightIndex + iVar5),status);
    this_local._4_4_ = iVar2 + iVar5;
  }
  else {
    UVar1 = (this->fUnion).padding.fPosition;
    paddingCp_00 = (this->fUnion).padding.fCp;
    if (UVar1 == UNUM_PAD_AFTER_PREFIX) {
      paddingCp = anon_unknown.dwarf_149bd1::addPaddingHelper
                            (paddingCp_00,iVar5,string,leftIndex,status);
    }
    else if (UVar1 == UNUM_PAD_BEFORE_SUFFIX) {
      paddingCp = anon_unknown.dwarf_149bd1::addPaddingHelper
                            (paddingCp_00,iVar5,string,rightIndex,status);
    }
    iVar2 = (*mod1->_vptr_Modifier[2])
                      (mod1,string,(ulong)(uint)leftIndex,(ulong)(uint)(rightIndex + paddingCp),
                       status);
    iVar3 = (*mod2->_vptr_Modifier[2])
                      (mod2,string,(ulong)(uint)leftIndex,
                       (ulong)(uint)(rightIndex + iVar2 + paddingCp),status);
    paddingCp = iVar3 + iVar2 + paddingCp;
    if (UVar1 == UNUM_PAD_BEFORE_PREFIX) {
      iVar4 = anon_unknown.dwarf_149bd1::addPaddingHelper
                        (paddingCp_00,iVar5,string,leftIndex,status);
      paddingCp = iVar4 + paddingCp;
    }
    else if (UVar1 == UNUM_PAD_AFTER_SUFFIX) {
      iVar4 = anon_unknown.dwarf_149bd1::addPaddingHelper
                        (paddingCp_00,iVar5,string,rightIndex + paddingCp,status);
      paddingCp = iVar4 + paddingCp;
    }
    this_local._4_4_ = paddingCp;
  }
  return this_local._4_4_;
}

Assistant:

int32_t Padder::padAndApply(const Modifier &mod1, const Modifier &mod2,
                            NumberStringBuilder &string, int32_t leftIndex, int32_t rightIndex,
                            UErrorCode &status) const {
    int32_t modLength = mod1.getCodePointCount() + mod2.getCodePointCount();
    int32_t requiredPadding = fWidth - modLength - string.codePointCount();
    U_ASSERT(leftIndex == 0 &&
             rightIndex == string.length()); // fix the previous line to remove this assertion

    int length = 0;
    if (requiredPadding <= 0) {
        // Padding is not required.
        length += mod1.apply(string, leftIndex, rightIndex, status);
        length += mod2.apply(string, leftIndex, rightIndex + length, status);
        return length;
    }

    PadPosition position = fUnion.padding.fPosition;
    UChar32 paddingCp = fUnion.padding.fCp;
    if (position == UNUM_PAD_AFTER_PREFIX) {
        length += addPaddingHelper(paddingCp, requiredPadding, string, leftIndex, status);
    } else if (position == UNUM_PAD_BEFORE_SUFFIX) {
        length += addPaddingHelper(paddingCp, requiredPadding, string, rightIndex + length, status);
    }
    length += mod1.apply(string, leftIndex, rightIndex + length, status);
    length += mod2.apply(string, leftIndex, rightIndex + length, status);
    if (position == UNUM_PAD_BEFORE_PREFIX) {
        length += addPaddingHelper(paddingCp, requiredPadding, string, leftIndex, status);
    } else if (position == UNUM_PAD_AFTER_SUFFIX) {
        length += addPaddingHelper(paddingCp, requiredPadding, string, rightIndex + length, status);
    }

    return length;
}